

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::TypePrinter::TypePrinter
          (TypePrinter *this,ostream *os,HeapTypeNameGenerator *generator)

{
  this->os = os;
  (this->defaultGenerator).super__Optional_base<wasm::DefaultTypeNameGenerator,_false,_false>.
  _M_payload.super__Optional_payload<wasm::DefaultTypeNameGenerator,_true,_false,_false>.
  super__Optional_payload_base<wasm::DefaultTypeNameGenerator>._M_engaged = false;
  std::function<wasm::TypeNames_(wasm::HeapType)>::function(&this->generator,generator);
  return;
}

Assistant:

TypePrinter(std::ostream& os, HeapTypeNameGenerator generator)
    : os(os), defaultGenerator(), generator(generator) {}